

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O0

Stream * rw::writeNativeData(Stream *stream,int32 len,void *object,int32 o,int32 s)

{
  Geometry *geometry;
  int32 s_local;
  int32 o_local;
  void *object_local;
  int32 len_local;
  Stream *stream_local;
  
  stream_local = stream;
  if (*(long *)((long)object + 0x98) != 0) {
    if (**(int **)((long)object + 0x98) == 4) {
      stream_local = ps2::writeNativeData(stream,len,object,o,s);
    }
    else if (**(int **)((long)object + 0x98) == 0xb) {
      stream_local = wdgl::writeNativeData(stream,len,object,o,s);
    }
    else if (**(int **)((long)object + 0x98) == 5) {
      stream_local = xbox::writeNativeData(stream,len,object,o,s);
    }
    else if (**(int **)((long)object + 0x98) == 8) {
      stream_local = d3d8::writeNativeData(stream,len,object,o,s);
    }
    else if (**(int **)((long)object + 0x98) == 9) {
      stream_local = d3d9::writeNativeData(stream,len,object,o,s);
    }
  }
  return stream_local;
}

Assistant:

static Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32 o, int32 s)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil)
		return stream;
	if(geometry->instData->platform == PLATFORM_PS2)
		return ps2::writeNativeData(stream, len, object, o, s);
	else if(geometry->instData->platform == PLATFORM_WDGL)
		return wdgl::writeNativeData(stream, len, object, o, s);
	else if(geometry->instData->platform == PLATFORM_XBOX)
		return xbox::writeNativeData(stream, len, object, o, s);
	else if(geometry->instData->platform == PLATFORM_D3D8)
		return d3d8::writeNativeData(stream, len, object, o, s);
	else if(geometry->instData->platform == PLATFORM_D3D9)
		return d3d9::writeNativeData(stream, len, object, o, s);
	return stream;
}